

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

BrandedDecl * __thiscall
capnp::compiler::NodeTranslator::BrandScope::interpretResolve
          (BrandedDecl *__return_storage_ptr__,BrandScope *this,Resolver *resolver,
          ResolveResult *result,Reader source)

{
  Reader brand_00;
  bool bVar1;
  BrandScope *pBVar2;
  Own<capnp::compiler::NodeTranslator::BrandScope> *brand_01;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *other;
  BrandedDecl *pBVar3;
  ResolvedParameter variable;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_300;
  undefined1 local_250 [8];
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> p;
  ResolvedParameter *param;
  ResolvedDecl local_168;
  undefined1 local_108 [24];
  Disposer *pDStack_f0;
  BrandScope *local_e8;
  uint64_t uStack_e0;
  undefined8 local_d8;
  BrandedDecl *pBStack_d0;
  ResolvedDecl local_c8;
  undefined1 local_68 [40];
  Reader *brand;
  Own<capnp::compiler::NodeTranslator::BrandScope> scope;
  ResolvedDecl *decl;
  ResolveResult *result_local;
  Resolver *resolver_local;
  BrandScope *this_local;
  
  bVar1 = kj::
          OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
          ::is<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>(result);
  if (bVar1) {
    scope.ptr = (BrandScope *)
                kj::
                OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                ::get<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>(result);
    pop((BrandScope *)&brand,(uint64_t)this);
    local_68._32_8_ =
         kj::_::readMaybe<capnp::schema::Brand::Reader>
                   ((Maybe<capnp::schema::Brand::Reader> *)&(scope.ptr)->leafId);
    if ((BrandScope *)local_68._32_8_ == (BrandScope *)0x0) {
      pBVar2 = kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator->
                         ((Own<capnp::compiler::NodeTranslator::BrandScope> *)&brand);
      push((BrandScope *)local_108,(uint64_t)pBVar2,
           (uint)((scope.ptr)->super_Refcounted).super_Disposer._vptr_Disposer);
      kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator=
                ((Own<capnp::compiler::NodeTranslator::BrandScope> *)&brand,
                 (Own<capnp::compiler::NodeTranslator::BrandScope> *)local_108);
      kj::Own<capnp::compiler::NodeTranslator::BrandScope>::~Own
                ((Own<capnp::compiler::NodeTranslator::BrandScope> *)local_108);
    }
    else {
      pBVar2 = kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator->
                         ((Own<capnp::compiler::NodeTranslator::BrandScope> *)&brand);
      Resolver::ResolvedDecl::ResolvedDecl(&local_c8,(ResolvedDecl *)scope.ptr);
      capnp::schema::Brand::Reader::getScopes
                ((Reader *)(local_108 + 0x10),(Reader *)local_68._32_8_);
      brand_00.reader.capTable = (CapTableReader *)pDStack_f0;
      brand_00.reader.segment = (SegmentReader *)local_108._16_8_;
      brand_00.reader.ptr = (byte *)local_e8;
      brand_00.reader.elementCount = (undefined4)uStack_e0;
      brand_00.reader.step = uStack_e0._4_4_;
      brand_00.reader._32_8_ = local_d8;
      brand_00.reader._40_8_ = pBStack_d0;
      evaluateBrand((BrandScope *)local_68,(Resolver *)pBVar2,(ResolvedDecl *)resolver,brand_00,
                    (uint)&local_c8);
      kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator=
                ((Own<capnp::compiler::NodeTranslator::BrandScope> *)&brand,
                 (Own<capnp::compiler::NodeTranslator::BrandScope> *)local_68);
      kj::Own<capnp::compiler::NodeTranslator::BrandScope>::~Own
                ((Own<capnp::compiler::NodeTranslator::BrandScope> *)local_68);
      Resolver::ResolvedDecl::~ResolvedDecl(&local_c8);
    }
    Resolver::ResolvedDecl::ResolvedDecl(&local_168,(ResolvedDecl *)scope.ptr);
    brand_01 = kj::mv<kj::Own<capnp::compiler::NodeTranslator::BrandScope>>
                         ((Own<capnp::compiler::NodeTranslator::BrandScope> *)&brand);
    BrandedDecl::BrandedDecl(__return_storage_ptr__,&local_168,brand_01,source);
    Resolver::ResolvedDecl::~ResolvedDecl(&local_168);
    kj::Own<capnp::compiler::NodeTranslator::BrandScope>::~Own
              ((Own<capnp::compiler::NodeTranslator::BrandScope> *)&brand);
  }
  else {
    p.field_1._160_8_ =
         kj::
         OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
         ::get<capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>(result);
    lookupParameter(&local_300,this,resolver,((ResolvedParameter *)p.field_1._160_8_)->id,
                    ((ResolvedParameter *)p.field_1._160_8_)->index);
    other = kj::_::readMaybe<capnp::compiler::NodeTranslator::BrandedDecl>(&local_300);
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
              ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_250,other);
    kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::~Maybe(&local_300);
    pBVar3 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_250);
    if (pBVar3 == (BrandedDecl *)0x0) {
      variable._12_4_ = 0;
      variable._0_12_ = *(undefined1 (*) [12])p.field_1._160_8_;
      BrandedDecl::BrandedDecl(__return_storage_ptr__,variable,source);
    }
    else {
      pBVar3 = kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator*
                         ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_250);
      BrandedDecl::BrandedDecl(__return_storage_ptr__,pBVar3);
    }
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
              ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_250);
  }
  return __return_storage_ptr__;
}

Assistant:

NodeTranslator::BrandedDecl NodeTranslator::BrandScope::interpretResolve(
    Resolver& resolver, Resolver::ResolveResult& result, Expression::Reader source) {
  if (result.is<Resolver::ResolvedDecl>()) {
    auto& decl = result.get<Resolver::ResolvedDecl>();

    auto scope = pop(decl.scopeId);
    KJ_IF_MAYBE(brand, decl.brand) {
      scope = scope->evaluateBrand(resolver, decl, brand->getScopes());
    } else {
      scope = scope->push(decl.id, decl.genericParamCount);
    }

    return BrandedDecl(decl, kj::mv(scope), source);
  }